

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

shared_ptr<cppcms::rpc::json_call> __thiscall
cppcms::rpc::json_rpc_server::release_call(json_rpc_server *this)

{
  element_type *peVar1;
  _data *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  json_rpc_server *in_RSI;
  shared_ptr<cppcms::rpc::json_call> sVar4;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  check_call(in_RSI);
  peVar1 = (in_RSI->current_call_).
           super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  application::release_context((application *)&local_30);
  (peVar1->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->context_).
              super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_28);
  _Var3._M_pi = extraout_RDX;
  if ((_data *)local_28._M_pi != (_data *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  (this->super_application)._vptr_application =
       (_func_int **)
       (in_RSI->current_call_).
       super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (_data *)(in_RSI->current_call_).
                    super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  (this->super_application).d.ptr_ = p_Var2;
  if (p_Var2 != (_data *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(p_Var2->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(p_Var2->conn).
                    super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      UNLOCK();
    }
    else {
      *(int *)&(p_Var2->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(p_Var2->conn).
                    super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
    }
  }
  this_00 = (in_RSI->current_call_).
            super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (in_RSI->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (in_RSI->current_call_).super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::rpc::json_call>)
         sVar4.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<json_call> json_rpc_server::release_call()
	{
		check_call();
		current_call_->attach_context(release_context());
		booster::shared_ptr<json_call> call = current_call_;
		current_call_.reset();
		return call;
	}